

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.c
# Opt level: O3

char * begin_dump(int how)

{
  FILE *pFVar1;
  schar sVar2;
  schar sVar3;
  schar sVar4;
  int __fd;
  tm *__tp;
  size_t sVar5;
  int *piVar6;
  long lVar7;
  int *piVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  FILE *__stream;
  time_t t;
  char timestamp [256];
  char dumpname_tmp [256];
  
  memcpy(&winprocs_original,&windowprocs,0x90);
  t = time((time_t *)0x0);
  __tp = localtime(&t);
  if ((__tp == (tm *)0x0) ||
     (sVar5 = strftime(timestamp,0x100,"%Y-%m-%d %H_%M_%S",__tp), sVar5 == 0)) {
    builtin_strncpy(timestamp,"???",4);
  }
  if (how - 0xeU < 4) {
    pcVar11 = &DAT_002a9a1c + *(int *)(&DAT_002a9a1c + (ulong)(how - 0xeU) * 4);
  }
  else {
    pcVar11 = "died";
  }
  sprintf(dumpname_tmp,"%s, %s-%s-%s-%s-%s, %s.txt",timestamp,plname,urole.filecode,urace.filecode,
          genders[flags.female].filecode,aligns[1 - (long)u.ualign.type].filecode,pcVar11);
  munge_xlstring(begin_dump::dumpname,dumpname_tmp,0x100);
  dumpfp = fopen_datafile(begin_dump::dumpname,"w+",5);
  if ((FILE *)dumpfp == (FILE *)0x0) {
    return (char *)0x0;
  }
  __fd = fileno((FILE *)dumpfp);
  if (__fd != -1) {
    fchmod(__fd,0x1a4);
  }
  pcVar11 = urole.name.f;
  if (urole.name.f == (char *)0x0) {
    pcVar11 = urole.name.m;
  }
  if ((long)flags.female == 0) {
    pcVar11 = urole.name.m;
  }
  fprintf((FILE *)dumpfp,"%s, %s %s %s %s\n",plname,aligns[1 - (long)u.ualign.type].adj,
          genders[flags.female].adj,urace.adj,pcVar11);
  dump_screen(dumpfp);
  pFVar1 = dumpfp;
  pcVar11 = rank_of(u.ulevel,urole.malenum,flags.female);
  fprintf((FILE *)pFVar1,"%s the %s\n",plname,pcVar11);
  fprintf((FILE *)dumpfp,"  Experience level: %d\n",(ulong)(uint)u.ulevel);
  sVar2 = acurr(0);
  pFVar1 = dumpfp;
  if (sVar2 < '\x13') {
    sVar2 = acurr(0);
    fprintf((FILE *)pFVar1,"  Strength: %-1d\n",(ulong)(uint)(int)sVar2);
  }
  else {
    sVar2 = acurr(0);
    __stream = (FILE *)dumpfp;
    if (sVar2 < 'v') {
      sVar2 = acurr(0);
      uVar9 = (int)sVar2 - 0x12;
      pcVar11 = "  Strength: 18/%02d\n";
    }
    else {
      sVar2 = acurr(0);
      __stream = (FILE *)dumpfp;
      if (sVar2 == 'v') {
        fwrite("  Strength: 18/**\n",0x12,1,(FILE *)dumpfp);
        goto LAB_00189a33;
      }
      sVar2 = acurr(0);
      uVar9 = (int)sVar2 - 100;
      pcVar11 = "  Strength: %-1d\n";
    }
    fprintf(__stream,pcVar11,(ulong)uVar9);
  }
LAB_00189a33:
  pFVar1 = dumpfp;
  sVar2 = acurr(3);
  sVar3 = acurr(4);
  fprintf((FILE *)pFVar1,"  Dexterity: %-1d\n  Constitution: %-1d\n",(ulong)(uint)(int)sVar2,
          (ulong)(uint)(int)sVar3);
  pFVar1 = dumpfp;
  sVar2 = acurr(1);
  sVar3 = acurr(2);
  sVar4 = acurr(5);
  fprintf((FILE *)pFVar1,"  Intelligence: %-1d\n  Wisdom: %-1d\n  Charisma: %-1d\n",
          (ulong)(uint)(int)sVar2,(ulong)(uint)(int)sVar3,(ulong)(uint)(int)sVar4);
  piVar8 = &u.mh;
  piVar6 = &u.uhpmax;
  if (u.umonnum == u.umonster) {
    piVar8 = &u.uhp;
  }
  if (u.umonnum != u.umonster) {
    piVar6 = &u.mhmax;
  }
  uVar10 = 0;
  if (0 < *piVar8) {
    uVar10 = (ulong)(uint)*piVar8;
  }
  fprintf((FILE *)dumpfp,"  Health: %d(%d)\n",uVar10,(ulong)(uint)*piVar6);
  fprintf((FILE *)dumpfp,"  Energy: %d(%d)\n",(ulong)(uint)u.uen,(ulong)(uint)u.uenmax);
  fprintf((FILE *)dumpfp,"  AC: %d\n",(ulong)(uint)(int)u.uac);
  pFVar1 = dumpfp;
  lVar7 = money_cnt(invent);
  fprintf((FILE *)pFVar1,"  Gold: %ld\n",lVar7);
  fprintf((FILE *)dumpfp,"  Moves: %u\n",(ulong)moves);
  fwrite("\n\n",2,1,(FILE *)dumpfp);
  return begin_dump::dumpname;
}

Assistant:

const char *begin_dump(int how)
{
    /* must be static, may be passed out of this function */
    static char dumpname[BUFSZ];

    char dumpname_tmp[BUFSZ], timestamp[BUFSZ], *status;
    const char *rolename;
    time_t t;
    struct tm *tmp;
#ifdef UNIX
    int dumpfd;
#endif

    /* back up the window procs */
    winprocs_original = windowprocs;

    /* make a timestamp like "2011-11-30 18:45:01" */
    t = time(NULL);
    tmp = localtime(&t);
    if (!tmp || !strftime(timestamp, sizeof(timestamp), "%Y-%m-%d %H_%M_%S", tmp))
	strcpy(timestamp, "???");

    switch(how) {
	case ASCENDED:	status = "ascended"; break;
	case QUIT:	status = "quit"; break;
	case ESCAPED:	status = "escaped"; break;
	default:	status = "died"; break;
    }

    sprintf(dumpname_tmp, "%s, %s-%s-%s-%s-%s, %s.txt", timestamp, plname,
	    urole.filecode, urace.filecode, genders[flags.female].filecode,
	    aligns[1-u.ualign.type].filecode, status);

    /* Run this through munge_xlstring() here rather than when writing to
     * xlogfile, so the filename here will match the one eventually written to
     * the xlogfile.
     */
    munge_xlstring(dumpname, dumpname_tmp, sizeof(dumpname));

    dumpfp = fopen_datafile(dumpname, "w+", DUMPPREFIX);
    if (!dumpfp)
	return NULL;

#ifdef UNIX
    /* 644 permissions for dumplogs */
    dumpfd = fileno(dumpfp);
    if (dumpfd != -1)
	fchmod(dumpfd, 0644);
#endif

    rolename = (flags.female && urole.name.f) ? urole.name.f : urole.name.m;
    fprintf(dumpfp, "%s, %s %s %s %s\n", plname, aligns[1-u.ualign.type].adj,
	    genders[flags.female].adj, urace.adj, rolename);

    dump_screen(dumpfp);
    dump_status();

    return dumpname;
}